

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O0

bool __thiscall
gmlc::concurrency::
SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
::checkObjectType(SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                  *this,string *name,char type)

{
  bool bVar1;
  pointer ppVar2;
  reference pcVar3;
  char *stype;
  const_iterator __end0;
  const_iterator __begin0;
  vector<char,_std::allocator<char>_> *__range4;
  _Self local_38;
  const_iterator fnd;
  lock_guard<std::mutex> lock;
  char type_local;
  string *name_local;
  SearchableObjectHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&fnd,&this->mapLock);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
       ::find(&this->typeMap,name);
  __range4 = (vector<char,_std::allocator<char>_> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::end(&this->typeMap);
  bVar1 = std::operator!=(&local_38,(_Self *)&__range4);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>
             ::operator->(&local_38);
    __end0 = std::vector<char,_std::allocator<char>_>::begin(&ppVar2->second);
    stype = (char *)std::vector<char,_std::allocator<char>_>::end(&ppVar2->second);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                       *)&stype), bVar1) {
      pcVar3 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
               ::operator*(&__end0);
      if (*pcVar3 == type) {
        this_local._7_1_ = true;
        goto LAB_00120fa7;
      }
      __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
      operator++(&__end0);
    }
  }
  this_local._7_1_ = false;
LAB_00120fa7:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&fnd);
  return this_local._7_1_;
}

Assistant:

bool checkObjectType(const std::string& name, Y type) const
    {
        std::lock_guard<std::mutex> lock(mapLock);
        auto fnd = typeMap.find(name);
        if (fnd != typeMap.end()) {
            for (auto& stype : fnd->second) {
                if (stype == type) {
                    return true;
                }
            }
        }
        return false;
    }